

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

int __thiscall Matrix::remove(Matrix *this,char *__filename)

{
  long lVar1;
  uint uVar2;
  int *piVar3;
  Physical *pPVar4;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  void *pvVar8;
  int i;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  uVar2 = this->nMatrixDimension;
  lVar15 = (long)(int)uVar2;
  uVar10 = 0xffffffffffffffff;
  if (-1 < lVar15) {
    uVar10 = lVar15 * 4;
  }
  piVar6 = (int *)operator_new__(uVar10);
  piVar3 = this->pSize;
  uVar7 = 0;
  uVar11 = 0;
  if (0 < (int)uVar2) {
    uVar11 = (ulong)uVar2;
  }
  for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
    iVar9 = piVar3[uVar7];
    piVar6[uVar7] = iVar9 - (uint)(1 < iVar9 && -1 < *(int *)(*(long *)__filename + uVar7 * 4));
  }
  pvVar8 = operator_new__(uVar10);
  for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    *(undefined4 *)((long)pvVar8 + uVar10 * 4) = 0;
  }
  iVar12 = 0;
  iVar9 = this->nData;
  if (this->nData < 1) {
    iVar9 = 0;
  }
LAB_0013437a:
  lVar16 = lVar15;
  lVar13 = lVar15 * 4 + -4;
  if (iVar12 == iVar9) {
    if (this->pMult != (int *)0x0) {
      operator_delete__(this->pMult);
    }
    pPVar4 = this->pPhysicals;
    if (pPVar4 != (Physical *)0x0) {
      lVar15 = *(long *)&pPVar4[-1].physicalUnit.nExpPrefix;
      if (lVar15 != 0) {
        lVar16 = lVar15 * 0x98;
        do {
          Physical::~Physical((Physical *)((long)pPVar4[-1].physicalUnit.siUnits + lVar16 + -0x34));
          lVar16 = lVar16 + -0x98;
        } while (lVar16 != 0);
      }
      operator_delete__(&pPVar4[-1].physicalUnit.nExpPrefix,lVar15 * 0x98 + 8);
    }
    if (this->pSize != (int *)0x0) {
      operator_delete__(this->pSize);
    }
    this->pSize = piVar6;
    init(this,(EVP_PKEY_CTX *)0x1);
    return (int)this;
  }
  do {
    *(int *)((long)pvVar8 + lVar13) = *(int *)((long)pvVar8 + lVar13) + 1;
    lVar13 = lVar16 * -4 + 4;
    lVar14 = lVar16;
    do {
      if (lVar14 == 1) {
        iVar12 = iVar12 + 1;
        goto LAB_0013437a;
      }
      lVar1 = lVar14 * 4;
      lVar13 = lVar13 + 4;
      lVar16 = lVar14 + -1;
      lVar5 = lVar14 + -1;
      lVar14 = lVar16;
    } while (*(int *)((long)pvVar8 + lVar1 + -4) < piVar3[lVar5]);
    *(undefined4 *)((long)pvVar8 + lVar16 * 4) = 0;
    lVar13 = -lVar13;
  } while( true );
}

Assistant:

Matrix &Matrix::remove(vector<int> removal)
{
	// create new data store and new shape vector
	int *newShape = new int[nMatrixDimension];
	int newSize = 1;
	for (int i=0; i<nMatrixDimension; ++i) {
		if (removal[i] >= 0 && pSize[i]>1)
			newShape[i] = pSize[i]-1;
		else
			newShape[i] = pSize[i];
		newSize *= newShape[i];
	}
	double *newData = new double[newSize];
	
	// vector with current index coordinates
	int *index = new int[nMatrixDimension];
	for (int i=0; i<nMatrixDimension; ++i)
		index[i] = 0;
	
	// copy each data point
	int n=0; // single index into new data
	for (int i=0; i<nData; ++i) {
		
		// compare index vector to removal vector
		bool copyData = true;
		for (int r=0; r<nMatrixDimension; ++r)
			if (removal[r] != -1 && index[r] == removal[r]) {
				copyData = false;
				break;
			}
		
		// copy if index does not match removal vector
		if (copyData)
			newData[n++] = pData[i];
		
		// increment  index vector
		index[nMatrixDimension-1]++;
		for (int k=nMatrixDimension-1; k; --k)
			if (index[k] >= pSize[k]) {
				index[k] = 0;
				index[k-1]++;
			}		
	}
	
	// assign new data
	delete[] pMult;
	delete[] pPhysicals;
	delete[] pSize;
	pSize = newShape;
	init();
	
	return *this;
}